

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignatureRefining::run(wasm
::Module*)::Info,(wasm::Mutability)1,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::
Info&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::
SignatureRefining::run(wasm::Module*)::Info,std::less<wasm::Function*>,std::allocator<std::pair<wasm
::Function*const,wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::Info>>>&,std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::
Info__>_(void *this,Module *module,Map *map,Func *work)

{
  Func *work_local;
  Map *map_local;
  Module *module_local;
  Mapper *this_local;
  
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_0309f058;
  *(Module **)((long)this + 0x130) = module;
  *(Map **)((long)this + 0x138) = map;
  std::function<void_(wasm::Function_*,_Info_&)>::function
            ((function<void_(wasm::Function_*,_Info_&)> *)((long)this + 0x140),
             (function<void_(wasm::Function_*,_Info_&)>_conflict1 *)work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}